

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.c
# Opt level: O3

int yaml_emitter_flush(yaml_emitter_t *emitter)

{
  yaml_encoding_t yVar1;
  yaml_write_handler_t *pyVar2;
  byte *pbVar3;
  yaml_char_t *pyVar4;
  uchar *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uchar *puVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uchar uVar16;
  uint uVar17;
  uint uVar18;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/writer.c"
                  ,0x24,"int yaml_emitter_flush(yaml_emitter_t *)");
  }
  pyVar2 = emitter->write_handler;
  if (pyVar2 == (yaml_write_handler_t *)0x0) {
    __assert_fail("emitter->write_handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/writer.c"
                  ,0x25,"int yaml_emitter_flush(yaml_emitter_t *)");
  }
  yVar1 = emitter->encoding;
  if (yVar1 == YAML_ANY_ENCODING) {
    __assert_fail("emitter->encoding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/writer.c"
                  ,0x26,"int yaml_emitter_flush(yaml_emitter_t *)");
  }
  pbVar11 = (emitter->buffer).start;
  pbVar3 = (emitter->buffer).pointer;
  (emitter->buffer).last = pbVar3;
  (emitter->buffer).pointer = pbVar11;
  iVar6 = 1;
  if (pbVar11 != pbVar3) {
    if (yVar1 == YAML_UTF8_ENCODING) {
      iVar6 = (*pyVar2)(emitter->write_handler_data,pbVar11,(long)pbVar3 - (long)pbVar11);
      if (iVar6 != 0) {
        pyVar4 = (emitter->buffer).start;
        (emitter->buffer).last = pyVar4;
        (emitter->buffer).pointer = pyVar4;
        return 1;
      }
    }
    else {
      uVar7 = (ulong)(yVar1 != YAML_UTF16LE_ENCODING);
      uVar8 = (ulong)(yVar1 == YAML_UTF16LE_ENCODING);
      do {
        uVar15 = (uint)*pbVar11;
        lVar9 = 1;
        if ((char)*pbVar11 < '\0') {
          if ((uVar15 & 0xffffffe0) == 0xc0) {
            uVar15 = uVar15 & 0x1f;
            lVar9 = 2;
          }
          else {
            uVar17 = uVar15 & 0xfffffff0;
            uVar18 = uVar15 & 0xfffffff8;
            lVar9 = (ulong)(uVar18 == 0xf0) << 2;
            if (uVar17 == 0xe0) {
              lVar9 = 3;
              uVar15 = uVar15 & 0xf;
            }
            else {
              uVar15 = uVar15 & 7;
              if (uVar18 != 0xf0) {
                uVar15 = 0;
              }
            }
            if (uVar17 != 0xe0 && uVar18 != 0xf0) goto LAB_0010a1b1;
          }
          lVar14 = 1;
          do {
            uVar18 = uVar15 << 6;
            uVar15 = pbVar11[lVar14] & 0x3f | uVar18;
            lVar14 = lVar14 + 1;
          } while (lVar9 != lVar14);
          (emitter->buffer).pointer = pbVar11 + lVar9;
          if (uVar18 < 0x10000) goto LAB_0010a1b8;
          (emitter->raw_buffer).last[uVar8] = (char)(uVar15 - 0x10000 >> 0x12) + 0xd8;
          (emitter->raw_buffer).last[uVar7] = (uchar)(uVar15 - 0x10000 >> 10);
          uVar16 = (char)(uVar18 >> 8) + 0xdc;
          lVar9 = 4;
          uVar12 = uVar7 ^ 3;
          uVar13 = uVar7 + 2;
        }
        else {
LAB_0010a1b1:
          (emitter->buffer).pointer = pbVar11 + lVar9;
LAB_0010a1b8:
          uVar16 = (uchar)(uVar15 >> 8);
          lVar9 = 2;
          uVar12 = uVar8;
          uVar13 = uVar7;
        }
        (emitter->raw_buffer).last[uVar12] = uVar16;
        (emitter->raw_buffer).last[uVar13] = (uchar)uVar15;
        puVar10 = (emitter->raw_buffer).last + lVar9;
        pbVar11 = (emitter->buffer).pointer;
        (emitter->raw_buffer).last = puVar10;
      } while (pbVar11 != (emitter->buffer).last);
      puVar5 = (emitter->raw_buffer).start;
      iVar6 = (*emitter->write_handler)
                        (emitter->write_handler_data,puVar5,(long)puVar10 - (long)puVar5);
      if (iVar6 != 0) {
        pyVar4 = (emitter->buffer).start;
        puVar10 = (emitter->raw_buffer).start;
        (emitter->buffer).last = pyVar4;
        (emitter->buffer).pointer = pyVar4;
        (emitter->raw_buffer).last = puVar10;
        (emitter->raw_buffer).pointer = puVar10;
        return 1;
      }
    }
    emitter->error = YAML_WRITER_ERROR;
    emitter->problem = "write error";
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_flush(yaml_emitter_t *emitter)
{
    int low, high;

    assert(emitter);    /* Non-NULL emitter object is expected. */
    assert(emitter->write_handler); /* Write handler must be set. */
    assert(emitter->encoding);  /* Output encoding must be set. */

    emitter->buffer.last = emitter->buffer.pointer;
    emitter->buffer.pointer = emitter->buffer.start;

    /* Check if the buffer is empty. */

    if (emitter->buffer.start == emitter->buffer.last) {
        return 1;
    }

    /* If the output encoding is UTF-8, we don't need to recode the buffer. */

    if (emitter->encoding == YAML_UTF8_ENCODING)
    {
        if (emitter->write_handler(emitter->write_handler_data,
                    emitter->buffer.start,
                    emitter->buffer.last - emitter->buffer.start)) {
            emitter->buffer.last = emitter->buffer.start;
            emitter->buffer.pointer = emitter->buffer.start;
            return 1;
        }
        else {
            return yaml_emitter_set_writer_error(emitter, "write error");
        }
    }

    /* Recode the buffer into the raw buffer. */

    low = (emitter->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
    high = (emitter->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

    while (emitter->buffer.pointer != emitter->buffer.last)
    {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        /*
         * See the "reader.c" code for more details on UTF-8 encoding.  Note
         * that we assume that the buffer contains a valid UTF-8 sequence.
         */

        /* Read the next UTF-8 character. */

        octet = emitter->buffer.pointer[0];

        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;

        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

        for (k = 1; k < width; k ++) {
            octet = emitter->buffer.pointer[k];
            value = (value << 6) + (octet & 0x3F);
        }

        emitter->buffer.pointer += width;

        /* Write the character. */

        if (value < 0x10000)
        {
            emitter->raw_buffer.last[high] = value >> 8;
            emitter->raw_buffer.last[low] = value & 0xFF;

            emitter->raw_buffer.last += 2;
        }
        else
        {
            /* Write the character using a surrogate pair (check "reader.c"). */

            value -= 0x10000;
            emitter->raw_buffer.last[high] = 0xD8 + (value >> 18);
            emitter->raw_buffer.last[low] = (value >> 10) & 0xFF;
            emitter->raw_buffer.last[high+2] = 0xDC + ((value >> 8) & 0xFF);
            emitter->raw_buffer.last[low+2] = value & 0xFF;

            emitter->raw_buffer.last += 4;
        }
    }

    /* Write the raw buffer. */

    if (emitter->write_handler(emitter->write_handler_data,
                emitter->raw_buffer.start,
                emitter->raw_buffer.last - emitter->raw_buffer.start)) {
        emitter->buffer.last = emitter->buffer.start;
        emitter->buffer.pointer = emitter->buffer.start;
        emitter->raw_buffer.last = emitter->raw_buffer.start;
        emitter->raw_buffer.pointer = emitter->raw_buffer.start;
        return 1;
    }
    else {
        return yaml_emitter_set_writer_error(emitter, "write error");
    }
}